

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Wrd_t *vFuncs;
  word *__s;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  char *p_00;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar9 = 1 << ((byte)nOuts & 0x1f);
  uVar5 = vRel->nSize;
  uVar11 = (long)(int)uVar5 / (long)(int)uVar9;
  iVar8 = (int)uVar11;
  uVar1 = nOuts * iVar8 * 2;
  vFuncs = (Vec_Wrd_t *)malloc(0x10);
  uVar2 = 0x10;
  if (0xe < nOuts * iVar8 * 2 - 1U) {
    uVar2 = uVar1;
  }
  vFuncs->nCap = uVar2;
  if (uVar2 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)(int)uVar2 << 3);
  }
  vFuncs->pArray = __s;
  vFuncs->nSize = uVar1;
  memset(__s,0,(long)(int)uVar1 << 3);
  if ((uVar5 & uVar9 - 1) != 0) {
    __assert_fail("Vec_WrdSize(vRel) % nMints == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x31a,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs(Gia_Man_t *, Vec_Wrd_t *, int)");
  }
  uVar5 = iVar8 * 0x40;
  if (0 < iVar8) {
    uVar2 = 1;
    if (1 < (int)uVar9) {
      uVar2 = uVar9;
    }
    uVar11 = uVar11 & 0xffffffff;
    uVar10 = 1;
    if (1 < (int)uVar5) {
      uVar10 = uVar5;
    }
    uVar3 = 0;
    iVar8 = 0;
    do {
      if (nOuts == 0x1f) {
        uVar6 = 0;
LAB_007c49f4:
        uVar13 = 0;
        uVar14 = 0;
        do {
          if ((uVar6 >> ((uint)uVar14 & 0x1f) & 1) == 0) {
            if (uVar1 <= uVar13) goto LAB_007c4a97;
            uVar12 = uVar14 * 2 * uVar11;
          }
          else {
            uVar12 = uVar11 + uVar13;
            if (uVar1 <= uVar12) {
LAB_007c4a97:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
          }
          __s[(uVar3 >> 6) + uVar12] = __s[(uVar3 >> 6) + uVar12] | 1L << ((byte)uVar3 & 0x3f);
          uVar14 = uVar14 + 1;
          uVar13 = uVar13 + uVar11 * 2;
        } while ((uint)nOuts != uVar14);
      }
      else {
        uVar7 = 0;
        do {
          uVar4 = (uVar3 << ((byte)nOuts & 0x1f)) + uVar7;
          uVar6 = uVar7;
          if ((vRel->pArray[(int)uVar4 >> 6] >> ((ulong)uVar4 & 0x3f) & 1) != 0) break;
          uVar7 = uVar7 + 1;
          uVar6 = uVar2;
        } while (uVar2 != uVar7);
        iVar8 = iVar8 + (uint)(uVar6 == uVar9);
        if (0 < nOuts) goto LAB_007c49f4;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar10);
    if (iVar8 != 0) {
      p_00 = "The relation is not well-defined for %d (out of %d) patterns.\n";
      printf("The relation is not well-defined for %d (out of %d) patterns.\n");
      goto LAB_007c4a76;
    }
  }
  p_00 = "The relation was successfully determized without don\'t-cares for %d patterns.\n";
  printf("The relation was successfully determized without don\'t-cares for %d patterns.\n",
         (ulong)uVar5);
LAB_007c4a76:
  Gia_ManSimRelCheckFuncs((Gia_Man_t *)p_00,vRel,nOuts,vFuncs);
  return vFuncs;
}

Assistant:

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts )
{
    int i, k, m, Count = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    Vec_Wrd_t * vFuncs = Vec_WrdStart( 2 * nOuts * nWords );
    assert( Vec_WrdSize(vRel) % nMints == 0 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                break;
        Count += m == nMints;
        for ( k = 0; k < nOuts; k++ )
            if ( (m >> k) & 1 )
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            else
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
    }
    if ( Count )
        printf( "The relation is not well-defined for %d (out of %d) patterns.\n", Count, 64 * nWords );
    else
        printf( "The relation was successfully determized without don't-cares for %d patterns.\n", 64 * nWords );
    Gia_ManSimRelCheckFuncs( p, vRel, nOuts, vFuncs );
    return vFuncs;
}